

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_string.hpp
# Opt level: O0

string * iutest::detail::ShowStringQuoted(string *__return_storage_ptr__,string *str)

{
  allocator<char> local_1a;
  undefined1 local_19;
  string *local_18;
  string *str_local;
  string *s;
  
  local_19 = 0;
  local_18 = str;
  str_local = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"\"",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_18);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string ShowStringQuoted(const ::std::string& str)
{
    ::std::string s = "\""; s += str; s += "\"";
    return s;
}